

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

int flatcc_json_printer_init_dynamic_buffer(flatcc_json_printer_t *ctx,size_t buffer_size)

{
  char *pcVar1;
  ulong local_20;
  size_t buffer_size_local;
  flatcc_json_printer_t *ctx_local;
  
  local_20 = buffer_size;
  if (buffer_size == 0) {
    local_20 = 0x1000;
  }
  if (local_20 < 0x40) {
    local_20 = 0x40;
  }
  memset(ctx,0,0x50);
  pcVar1 = (char *)malloc(local_20);
  ctx->buf = pcVar1;
  ctx->own_buffer = '\x01';
  ctx->size = local_20;
  ctx->flush_size = ctx->size - 0x40;
  ctx->p = ctx->buf;
  ctx->pflush = ctx->buf + ctx->flush_size;
  ctx->flush = __flatcc_json_printer_flush_dynamic_buffer;
  if (ctx->buf == (char *)0x0) {
    flatcc_json_printer_set_error(ctx,3);
    ctx_local._4_4_ = -1;
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int flatcc_json_printer_init_dynamic_buffer(flatcc_json_printer_t *ctx, size_t buffer_size)
{
    if (buffer_size == 0) {
        buffer_size = FLATCC_JSON_PRINT_DYN_BUFFER_SIZE;
    }
    if (buffer_size < FLATCC_JSON_PRINT_RESERVE) {
        buffer_size = FLATCC_JSON_PRINT_RESERVE;
    }
    memset(ctx, 0, sizeof(*ctx));
    ctx->buf = FLATCC_JSON_PRINTER_ALLOC(buffer_size);
    ctx->own_buffer = 1;
    ctx->size = buffer_size;
    ctx->flush_size = ctx->size - FLATCC_JSON_PRINT_RESERVE;
    ctx->p = ctx->buf;
    ctx->pflush = ctx->buf + ctx->flush_size;
    ctx->flush = __flatcc_json_printer_flush_dynamic_buffer;
    if (!ctx->buf) {
        RAISE_ERROR(overflow);
        return -1;
    }
    return 0;
}